

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O2

char * __thiscall
GeneratedSaxParser::ParserTemplateBase::getNameByStringHash
          (ParserTemplateBase *this,StringHash *hash)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  
  if (*hash != 0) {
    cVar1 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_char_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_char_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_char_*>_>_>
            ::find(&(this->mHashNameMap)._M_t,hash);
    if ((_Rb_tree_header *)cVar1._M_node == &(this->mHashNameMap)._M_t._M_impl.super__Rb_tree_header
       ) {
      p_Var2 = (_Base_ptr)0x0;
    }
    else {
      p_Var2 = cVar1._M_node[1]._M_parent;
    }
    return (char *)p_Var2;
  }
  return (char *)0x0;
}

Assistant:

const char* ParserTemplateBase::getNameByStringHash( const StringHash& hash ) const
	{
		if ( hash == 0 )
			return 0;
		ElementNameMap::const_iterator it = mHashNameMap.find(hash);
		if ( it == mHashNameMap.end() )
			return 0;
		else
			return it->second;
	}